

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O1

Factor * __thiscall
libDAI::LCLin::Hdelpe
          (Factor *__return_storage_ptr__,LCLin *this,size_t i,Factor *fac,size_t Y,VarSet *ns)

{
  size_t sVar1;
  Factor *pFVar2;
  VarSet *pVVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TFactor<double> *this_00;
  undefined4 extraout_var_02;
  long lVar5;
  size_t *psVar6;
  ulong uVar7;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> facs;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> pfacs;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_e8;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> local_c8
  ;
  Factor *local_b0;
  VarSet *local_a8;
  vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_> local_a0
  ;
  VarSet local_88;
  TFactor<double> local_68;
  
  local_e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((fac->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (fac->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (&local_e8,fac);
  }
  local_c8.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = __return_storage_ptr__;
  local_a8 = ns;
  iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  psVar6 = *(size_t **)(*(long *)(CONCAT44(extraout_var,iVar4) + 0x70) + i * 0x18);
  while( true ) {
    iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if (psVar6 == *(size_t **)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0x70) + 8 + i * 0x18))
    break;
    if (*psVar6 != Y) {
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      this_00 = (TFactor<double> *)
                (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x50))
                          ((long *)CONCAT44(extraout_var_01,iVar4),*psVar6);
      sVar1 = *psVar6;
      iVar4 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::operator*
                (&local_68,this_00,
                 (this->_phis).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0x58) + i * 0x18) +
                          sVar1 * 8));
      std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
      emplace_back<libDAI::TFactor<double>>
                ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)
                 &local_e8,&local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    psVar6 = psVar6 + 1;
  }
  if (local_e8.
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      local_e8.
      super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl
      .super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)&((local_e8.
                              super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar5);
      std::vector<libDAI::TFactor<double>const*,std::allocator<libDAI::TFactor<double>const*>>::
      emplace_back<libDAI::TFactor<double>const*>
                ((vector<libDAI::TFactor<double>const*,std::allocator<libDAI::TFactor<double>const*>>
                  *)&local_c8,(TFactor<double> **)&local_68);
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x38;
    } while (uVar7 < (ulong)(((long)local_e8.
                                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.
                                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
  }
  pVVar3 = local_a8;
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::vector(&local_88._vars,&local_a8->_vars);
  local_88._statespace = pVVar3->_statespace;
  std::vector<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>::
  vector(&local_a0,&local_c8);
  pFVar2 = local_b0;
  notSumProd(local_b0,this,&local_88,&local_a0);
  if (local_a0.
      super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0.
                    super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0.
                          super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0.
                          super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.
      super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<const_libDAI::TFactor<double>_*,_std::allocator<const_libDAI::TFactor<double>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_e8);
  return pFVar2;
}

Assistant:

Factor LCLin::Hdelpe( size_t i, const Factor &fac, size_t Y, VarSet ns ) {
        std::vector<Factor> facs;
        if( fac.vars().size() )
            facs.push_back( fac );
        std::vector<const Factor *> pfacs;
        for( FactorGraph::nb_cit I = grm().nbV(i).begin(); I != grm().nbV(i).end(); I++ )
            if( *I != Y )
                facs.push_back( grm().factor(*I) * phi(i,*I) );
        for( size_t K = 0; K < facs.size(); K++ )
            pfacs.push_back( &(facs[K]) );
        return notSumProd( ns, pfacs );
    }